

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5WriteInit(Fts5Index *p,Fts5SegWriter *pWriter,int iSegid)

{
  int *pRc;
  u8 *puVar1;
  char *zSql;
  u32 nByte;
  
  nByte = p->pConfig->pgsz + 0x14;
  *(undefined8 *)pWriter = 0;
  (pWriter->writer).pgno = 0;
  (pWriter->writer).iPrevPgidx = 0;
  (pWriter->btterm).p = (u8 *)0x0;
  (pWriter->btterm).n = 0;
  (pWriter->btterm).nSpace = 0;
  pWriter->nEmpty = 0;
  pWriter->nDlidx = 0;
  pWriter->aDlidx = (Fts5DlidxWriter *)0x0;
  pWriter->iPrevRowid = 0;
  pWriter->bFirstRowidInDoclist = '\0';
  pWriter->bFirstRowidInPage = '\0';
  pWriter->bFirstTermInPage = '\0';
  pWriter->field_0x4b = 0;
  pWriter->nLeafWritten = 0;
  (pWriter->writer).term.p = (u8 *)0x0;
  (pWriter->writer).term.n = 0;
  (pWriter->writer).term.nSpace = 0;
  (pWriter->writer).pgidx.p = (u8 *)0x0;
  (pWriter->writer).pgidx.n = 0;
  (pWriter->writer).pgidx.nSpace = 0;
  (pWriter->writer).buf.p = (u8 *)0x0;
  (pWriter->writer).buf.n = 0;
  (pWriter->writer).buf.nSpace = 0;
  *(undefined8 *)&pWriter->iBtPage = 0;
  pWriter->iSegid = iSegid;
  fts5WriteDlidxGrow(p,pWriter,1);
  (pWriter->writer).pgno = 1;
  pWriter->bFirstTermInPage = '\x01';
  pWriter->iBtPage = 1;
  pRc = &p->rc;
  sqlite3Fts5BufferSize(pRc,&(pWriter->writer).pgidx,nByte);
  sqlite3Fts5BufferSize(pRc,&(pWriter->writer).buf,nByte);
  if (p->pIdxWriter == (sqlite3_stmt *)0x0) {
    zSql = sqlite3_mprintf("INSERT INTO \'%q\'.\'%q_idx\'(segid,term,pgno) VALUES(?,?,?)",
                           p->pConfig->zDb,p->pConfig->zName);
    fts5IndexPrepareStmt(p,&p->pIdxWriter,zSql);
  }
  if (*pRc != 0) {
    return;
  }
  puVar1 = (pWriter->writer).buf.p;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  (pWriter->writer).buf.n = 4;
  sqlite3_bind_int64(p->pIdxWriter,1,(long)pWriter->iSegid);
  return;
}

Assistant:

static void fts5WriteInit(
  Fts5Index *p, 
  Fts5SegWriter *pWriter, 
  int iSegid
){
  const int nBuffer = p->pConfig->pgsz + FTS5_DATA_PADDING;

  memset(pWriter, 0, sizeof(Fts5SegWriter));
  pWriter->iSegid = iSegid;

  fts5WriteDlidxGrow(p, pWriter, 1);
  pWriter->writer.pgno = 1;
  pWriter->bFirstTermInPage = 1;
  pWriter->iBtPage = 1;

  assert( pWriter->writer.buf.n==0 );
  assert( pWriter->writer.pgidx.n==0 );

  /* Grow the two buffers to pgsz + padding bytes in size. */
  sqlite3Fts5BufferSize(&p->rc, &pWriter->writer.pgidx, nBuffer);
  sqlite3Fts5BufferSize(&p->rc, &pWriter->writer.buf, nBuffer);

  if( p->pIdxWriter==0 ){
    Fts5Config *pConfig = p->pConfig;
    fts5IndexPrepareStmt(p, &p->pIdxWriter, sqlite3_mprintf(
          "INSERT INTO '%q'.'%q_idx'(segid,term,pgno) VALUES(?,?,?)", 
          pConfig->zDb, pConfig->zName
    ));
  }

  if( p->rc==SQLITE_OK ){
    /* Initialize the 4-byte leaf-page header to 0x00. */
    memset(pWriter->writer.buf.p, 0, 4);
    pWriter->writer.buf.n = 4;

    /* Bind the current output segment id to the index-writer. This is an
    ** optimization over binding the same value over and over as rows are
    ** inserted into %_idx by the current writer.  */
    sqlite3_bind_int(p->pIdxWriter, 1, pWriter->iSegid);
  }
}